

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall helics::Federate::finalizeAsync(Federate *this)

{
  Modes MVar1;
  undefined8 uVar2;
  shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *this_00;
  Federate *in_RDI;
  Federate *in_stack_00000010;
  handle asyncInfo;
  type finalizeFunc;
  Federate *in_stack_ffffffffffffff90;
  string_view in_stack_ffffffffffffff98;
  lock_handle<helics::AsyncFedCallInfo,_std::mutex> local_50;
  Federate *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  type *in_stack_fffffffffffffff0;
  Federate *this_01;
  launch __policy;
  
  if ((in_RDI->singleThreadFederate & 1U) == 0) {
    this_01 = in_RDI;
    MVar1 = std::atomic::operator_cast_to_Modes((atomic<helics::Federate::Modes> *)0x20999c);
    this_00 = (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)
              (ulong)(byte)(MVar1 - FINALIZE);
    switch(this_00) {
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x0:
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x1:
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x6:
      return;
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x2:
      enterInitializingModeComplete(in_stack_ffffffffffffffd0);
      break;
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x3:
      enterExecutingModeComplete(this_01);
      break;
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x4:
      requestTimeComplete((Federate *)CONCAT71(in_stack_ffffffffffffffd9,in_stack_ffffffffffffffd8))
      ;
      break;
    case (shared_guarded<helics::AsyncFedCallInfo,_std::mutex> *)0x5:
      requestTimeIterativeComplete(in_stack_00000010);
    }
    __policy = (launch)((ulong)this_01 >> 0x20);
    std::
    unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
    ::operator->((unique_ptr<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>,_std::default_delete<gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>_>_>
                  *)0x209a12);
    gmlc::libguarded::shared_guarded<helics::AsyncFedCallInfo,_std::mutex>::lock(this_00);
    updateFederateMode(in_stack_ffffffffffffff90,(Modes)((ulong)in_RDI >> 0x38));
    std::async<helics::Federate::finalizeAsync()::__0&>(__policy,in_stack_fffffffffffffff0);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::operator->(&local_50);
    std::future<void>::operator=((future<void> *)in_stack_ffffffffffffff90,(future<void> *)in_RDI);
    std::future<void>::~future((future<void> *)0x209a6b);
    gmlc::libguarded::lock_handle<helics::AsyncFedCallInfo,_std::mutex>::~lock_handle
              ((lock_handle<helics::AsyncFedCallInfo,_std::mutex> *)0x209a75);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff90,
             (char *)in_RDI);
  InvalidFunctionCall::InvalidFunctionCall
            ((InvalidFunctionCall *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  __cxa_throw(uVar2,&InvalidFunctionCall::typeinfo,InvalidFunctionCall::~InvalidFunctionCall);
}

Assistant:

void Federate::finalizeAsync()
{
    if (singleThreadFederate) {
        throw(InvalidFunctionCall(
            "Async function calls and methods are not allowed for single thread federates"));
    }
    switch (currentMode) {
        case Modes::PENDING_INIT:
            enterInitializingModeComplete();
            break;
        case Modes::PENDING_EXEC:
            enterExecutingModeComplete();
            break;
        case Modes::PENDING_TIME:
            requestTimeComplete();
            break;
        case Modes::PENDING_ITERATIVE_TIME:
            requestTimeIterativeComplete();
            break;
        case Modes::FINALIZE:
        case Modes::ERROR_STATE:
        case Modes::PENDING_FINALIZE:
            return;
            // do nothing
        default:
            break;
    }
    auto finalizeFunc = [this]() { return coreObject->finalize(fedID); };
    auto asyncInfo = asyncCallInfo->lock();
    updateFederateMode(Modes::PENDING_FINALIZE);
    asyncInfo->finalizeFuture = std::async(std::launch::async, finalizeFunc);
}